

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to4.h
# Opt level: O2

void ncnn::im2col_sgemm_pack8to4_avx
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int *piVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  _func_int ***ppp_Var16;
  float *pfVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 (*pauVar22) [32];
  long lVar23;
  int iVar24;
  long lVar25;
  int iVar26;
  undefined1 (*pauVar27) [32];
  ulong uVar28;
  undefined1 (*pauVar29) [32];
  long lVar30;
  undefined1 (*pauVar31) [16];
  undefined1 (*pauVar32) [16];
  int q;
  ulong uVar33;
  long lVar34;
  long lVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 local_c8 [64];
  size_t local_88;
  ulong local_80;
  ulong local_78;
  uint local_6c;
  void *local_68;
  Mat *local_60;
  float zeros [8];
  
  uVar4 = bottom_im2col->w;
  lVar35 = (long)(int)uVar4;
  iVar14 = bottom_im2col->h;
  uVar19 = bottom_im2col->c;
  local_78 = (ulong)top_blob->c;
  local_68 = _bias->data;
  local_88 = 0;
  local_c8._0_8_ = (Allocator *)0x0;
  local_c8._8_4_ = 0;
  local_c8._12_4_ = 0;
  local_c8._16_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_c8._24_4_ = 0;
  local_c8._48_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  if (lVar35 < 8) {
    iVar24 = iVar14;
    uVar18 = uVar4;
    if (3 < (int)uVar4) {
      iVar24 = iVar14 * 4;
      uVar18 = (uVar4 & 3) + 1;
    }
  }
  else {
    iVar24 = iVar14 * 8;
    uVar18 = (uVar4 & 3) + (uVar4 >> 3) + (uint)((uVar4 >> 2 & 1) != 0);
  }
  local_c8._32_8_ = local_c8._0_8_;
  local_c8._40_4_ = local_c8._8_4_;
  local_c8._44_4_ = local_c8._12_4_;
  local_60 = top_blob;
  Mat::create((Mat *)local_c8,iVar24,uVar19,uVar18,0x20,8,opt->workspace_allocator);
  iVar13 = (int)((long)(int)uVar4 / 8);
  uVar15 = 0;
  iVar24 = 0;
  if (0 < iVar14) {
    iVar24 = iVar14;
  }
  uVar28 = 0;
  if (0 < (int)uVar19) {
    uVar28 = (ulong)uVar19;
  }
  uVar20 = 0;
  if (0 < iVar13) {
    uVar20 = (long)(int)uVar4 / 8 & 0xffffffff;
  }
  lVar30 = (long)(int)(uVar4 * 8) * 4;
  lVar25 = 0x80;
  for (; uVar15 != uVar20; uVar15 = uVar15 + 1) {
    ppp_Var16 = (_func_int ***)
                ((long)(_func_int ***)local_c8._0_8_ + local_88 * uVar15 * local_c8._16_8_);
    for (uVar33 = 0; uVar33 != uVar28; uVar33 = uVar33 + 1) {
      pauVar22 = (undefined1 (*) [32])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar33 + lVar25);
      iVar26 = iVar24;
      while (bVar36 = iVar26 != 0, iVar26 = iVar26 + -1, bVar36) {
        auVar42 = vunpcklps_avx(pauVar22[-4],pauVar22[-3]);
        auVar43 = vunpckhps_avx(pauVar22[-4],pauVar22[-3]);
        auVar59 = vunpcklps_avx(pauVar22[-2],pauVar22[-1]);
        auVar48 = vunpckhps_avx(pauVar22[-2],pauVar22[-1]);
        auVar68 = vunpcklps_avx(*pauVar22,pauVar22[1]);
        auVar49 = vunpckhps_avx(*pauVar22,pauVar22[1]);
        auVar67 = vunpcklps_avx(pauVar22[2],pauVar22[3]);
        auVar54 = vunpckhps_avx(pauVar22[2],pauVar22[3]);
        auVar62 = vunpcklpd_avx(auVar42,auVar59);
        auVar42 = vunpckhpd_avx(auVar42,auVar59);
        auVar59 = vunpcklpd_avx(auVar43,auVar48);
        auVar43 = vunpckhpd_avx(auVar43,auVar48);
        auVar63 = vunpcklpd_avx(auVar68,auVar67);
        auVar48 = vunpckhpd_avx(auVar68,auVar67);
        auVar68 = vunpcklpd_avx(auVar49,auVar54);
        auVar49 = vunpckhpd_avx(auVar49,auVar54);
        auVar67._16_16_ = auVar63._0_16_;
        auVar67._0_16_ = auVar62._0_16_;
        auVar73._16_16_ = auVar48._0_16_;
        auVar73._0_16_ = auVar42._0_16_;
        auVar78._16_16_ = auVar68._0_16_;
        auVar78._0_16_ = auVar59._0_16_;
        auVar79._16_16_ = auVar49._0_16_;
        auVar79._0_16_ = auVar43._0_16_;
        auVar54 = vperm2f128_avx(auVar62,auVar63,0x31);
        auVar42 = vperm2f128_avx(auVar42,auVar48,0x31);
        auVar48 = vperm2f128_avx(auVar59,auVar68,0x31);
        auVar43 = vperm2f128_avx(auVar43,auVar49,0x31);
        *(undefined1 (*) [32])ppp_Var16 = auVar67;
        *(undefined1 (*) [32])(ppp_Var16 + 4) = auVar73;
        *(undefined1 (*) [32])(ppp_Var16 + 8) = auVar78;
        *(undefined1 (*) [32])(ppp_Var16 + 0xc) = auVar79;
        *(undefined1 (*) [32])(ppp_Var16 + 0x10) = auVar54;
        *(undefined1 (*) [32])(ppp_Var16 + 0x14) = auVar42;
        *(undefined1 (*) [32])(ppp_Var16 + 0x18) = auVar48;
        *(undefined1 (*) [32])(ppp_Var16 + 0x1c) = auVar43;
        ppp_Var16 = ppp_Var16 + 0x20;
        pauVar22 = (undefined1 (*) [32])(*pauVar22 + lVar30);
      }
    }
    lVar25 = lVar25 + 0x100;
  }
  iVar26 = iVar13 * 8;
  local_6c = uVar4 + iVar13 * -8;
  uVar20 = 0;
  uVar15 = (ulong)(uint)((int)local_6c >> 2);
  if ((int)local_6c >> 2 < 1) {
    uVar15 = uVar20;
  }
  uVar33 = (long)iVar26 << 5 | 0x40;
  for (; uVar20 != uVar15; uVar20 = uVar20 + 1) {
    iVar13 = iVar26 + (int)uVar20 * 4;
    ppp_Var16 = (_func_int ***)
                ((long)(_func_int ***)local_c8._0_8_ +
                (long)((iVar13 % 8 >> 2) + iVar13 / 8) * local_88 * local_c8._16_8_);
    for (uVar21 = 0; uVar21 != uVar28; uVar21 = uVar21 + 1) {
      pauVar22 = (undefined1 (*) [32])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar21 + uVar33);
      iVar13 = iVar24;
      while (bVar36 = iVar13 != 0, iVar13 = iVar13 + -1, bVar36) {
        auVar42 = vunpcklps_avx(pauVar22[-2],pauVar22[-1]);
        auVar43 = vunpckhps_avx(pauVar22[-2],pauVar22[-1]);
        auVar54 = vunpcklps_avx(*pauVar22,pauVar22[1]);
        auVar48 = vunpckhps_avx(*pauVar22,pauVar22[1]);
        auVar49 = vunpcklpd_avx(auVar42,auVar54);
        auVar42 = vunpckhpd_avx(auVar42,auVar54);
        auVar54 = vunpcklpd_avx(auVar43,auVar48);
        auVar43 = vunpckhpd_avx(auVar43,auVar48);
        auVar48._16_16_ = auVar42._0_16_;
        auVar48._0_16_ = auVar49._0_16_;
        auVar62._16_16_ = auVar43._0_16_;
        auVar62._0_16_ = auVar54._0_16_;
        auVar42 = vperm2f128_avx(auVar49,auVar42,0x31);
        auVar43 = vperm2f128_avx(auVar54,auVar43,0x31);
        *(undefined1 (*) [32])ppp_Var16 = auVar48;
        *(undefined1 (*) [32])(ppp_Var16 + 4) = auVar62;
        *(undefined1 (*) [32])(ppp_Var16 + 8) = auVar42;
        *(undefined1 (*) [32])(ppp_Var16 + 0xc) = auVar43;
        ppp_Var16 = ppp_Var16 + 0x10;
        pauVar22 = (undefined1 (*) [32])(*pauVar22 + lVar30);
      }
    }
    uVar33 = uVar33 + 0x80;
  }
  uVar15 = (ulong)(int)((local_6c & 0xfffffffc) + iVar26);
  lVar25 = uVar15 << 5;
  for (; (long)uVar15 < lVar35; uVar15 = uVar15 + 1) {
    uVar18 = (int)uVar15 >> 0x1f;
    uVar20 = (ulong)uVar18 << 0x20 | uVar15 & 0xffffffff;
    ppp_Var16 = (_func_int ***)
                ((long)(_func_int ***)local_c8._0_8_ +
                (long)((int)((long)((ulong)uVar18 << 0x20 | uVar15 & 0xffffffff) % 4) +
                       (int)((long)uVar20 / 8) + (int)(char)((char)((long)uVar20 % 8) / '\x04')) *
                local_88 * local_c8._16_8_);
    for (uVar20 = 0; uVar20 != uVar28; uVar20 = uVar20 + 1) {
      pauVar22 = (undefined1 (*) [32])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar20 + lVar25);
      iVar13 = iVar24;
      while (bVar36 = iVar13 != 0, iVar13 = iVar13 + -1, bVar36) {
        *(undefined1 (*) [32])ppp_Var16 = *pauVar22;
        ppp_Var16 = ppp_Var16 + 4;
        pauVar22 = (undefined1 (*) [32])(*pauVar22 + lVar30);
      }
    }
    lVar25 = lVar25 + 0x20;
  }
  uVar18 = (int)local_78 >> 1;
  uVar28 = 0;
  uVar15 = (ulong)(uVar19 * iVar14 * 8);
  if ((int)(uVar19 * iVar14 * 8) < 1) {
    uVar15 = uVar28;
  }
  local_80 = (ulong)uVar18;
  if ((int)uVar18 < 1) {
    local_80 = uVar28;
  }
  for (; uVar28 != local_80; uVar28 = uVar28 + 1) {
    pauVar27 = (undefined1 (*) [32])
               (uVar28 * 2 * local_60->cstep * local_60->elemsize + (long)local_60->data);
    pauVar29 = (undefined1 (*) [32])
               ((uVar28 * 2 + 1) * local_60->cstep * local_60->elemsize + (long)local_60->data);
    zeros._0_16_ = ZEXT816(0);
    zeros[4] = 0.0;
    zeros[5] = 0.0;
    zeros[6] = 0.0;
    zeros[7] = 0.0;
    pauVar22 = (undefined1 (*) [32])(uVar28 * 0x20 + (long)local_68);
    if (local_68 == (void *)0x0) {
      pauVar22 = (undefined1 (*) [32])zeros;
    }
    lVar25 = 0;
    for (uVar20 = 0; (long)(uVar20 | 7) < lVar35; uVar20 = uVar20 + 8) {
      auVar42 = *pauVar22;
      lVar34 = local_88 * local_c8._16_8_ * lVar25;
      lVar30 = 0;
      uVar33 = uVar15;
      auVar43 = auVar42;
      auVar48 = auVar42;
      auVar49 = auVar42;
      auVar54 = auVar42;
      auVar62 = auVar42;
      auVar59 = auVar42;
      auVar63 = auVar42;
      while (iVar14 = (int)uVar33, uVar33 = (ulong)(iVar14 - 1), iVar14 != 0) {
        fVar1 = *(float *)((long)(_func_int ***)local_c8._0_8_ + lVar30 + lVar34);
        auVar68 = *(undefined1 (*) [32])
                   ((long)kernel->data + lVar30 + kernel->cstep * uVar28 * kernel->elemsize);
        fVar2 = *(float *)((long)(_func_int ***)local_c8._0_8_ + lVar30 + lVar34 + 4);
        fVar5 = auVar68._0_4_;
        fVar6 = auVar68._4_4_;
        fVar7 = auVar68._8_4_;
        fVar8 = auVar68._12_4_;
        fVar9 = auVar68._16_4_;
        fVar10 = auVar68._20_4_;
        fVar11 = auVar68._24_4_;
        auVar72._0_4_ = fVar1 * fVar5 + auVar63._0_4_;
        auVar72._4_4_ = fVar1 * fVar6 + auVar63._4_4_;
        auVar72._8_4_ = fVar1 * fVar7 + auVar63._8_4_;
        auVar72._12_4_ = fVar1 * fVar8 + auVar63._12_4_;
        auVar72._16_4_ = fVar1 * fVar9 + auVar63._16_4_;
        auVar72._20_4_ = fVar1 * fVar10 + auVar63._20_4_;
        auVar72._24_4_ = fVar1 * fVar11 + auVar63._24_4_;
        auVar72._28_4_ = fVar1 + auVar63._28_4_;
        fVar3 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 8))->_vptr_Allocator +
                          lVar30 + lVar34);
        auVar70._0_4_ = fVar2 * fVar5 + auVar59._0_4_;
        auVar70._4_4_ = fVar2 * fVar6 + auVar59._4_4_;
        auVar70._8_4_ = fVar2 * fVar7 + auVar59._8_4_;
        auVar70._12_4_ = fVar2 * fVar8 + auVar59._12_4_;
        auVar70._16_4_ = fVar2 * fVar9 + auVar59._16_4_;
        auVar70._20_4_ = fVar2 * fVar10 + auVar59._20_4_;
        auVar70._24_4_ = fVar2 * fVar11 + auVar59._24_4_;
        auVar70._28_4_ = fVar1 + auVar59._28_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 8))->_vptr_Allocator +
                          lVar30 + lVar34 + 4);
        auVar68._0_4_ = fVar3 * fVar5 + auVar62._0_4_;
        auVar68._4_4_ = fVar3 * fVar6 + auVar62._4_4_;
        auVar68._8_4_ = fVar3 * fVar7 + auVar62._8_4_;
        auVar68._12_4_ = fVar3 * fVar8 + auVar62._12_4_;
        auVar68._16_4_ = fVar3 * fVar9 + auVar62._16_4_;
        auVar68._20_4_ = fVar3 * fVar10 + auVar62._20_4_;
        auVar68._24_4_ = fVar3 * fVar11 + auVar62._24_4_;
        auVar68._28_4_ = fVar3 + auVar62._28_4_;
        fVar2 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 0x10))->_vptr_Allocator +
                          lVar30 + lVar34);
        auVar63._0_4_ = fVar1 * fVar5 + auVar54._0_4_;
        auVar63._4_4_ = fVar1 * fVar6 + auVar54._4_4_;
        auVar63._8_4_ = fVar1 * fVar7 + auVar54._8_4_;
        auVar63._12_4_ = fVar1 * fVar8 + auVar54._12_4_;
        auVar63._16_4_ = fVar1 * fVar9 + auVar54._16_4_;
        auVar63._20_4_ = fVar1 * fVar10 + auVar54._20_4_;
        auVar63._24_4_ = fVar1 * fVar11 + auVar54._24_4_;
        auVar63._28_4_ = fVar1 + auVar54._28_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 0x10))->_vptr_Allocator +
                          lVar30 + lVar34 + 4);
        auVar59._0_4_ = fVar2 * fVar5 + auVar49._0_4_;
        auVar59._4_4_ = fVar2 * fVar6 + auVar49._4_4_;
        auVar59._8_4_ = fVar2 * fVar7 + auVar49._8_4_;
        auVar59._12_4_ = fVar2 * fVar8 + auVar49._12_4_;
        auVar59._16_4_ = fVar2 * fVar9 + auVar49._16_4_;
        auVar59._20_4_ = fVar2 * fVar10 + auVar49._20_4_;
        auVar59._24_4_ = fVar2 * fVar11 + auVar49._24_4_;
        auVar59._28_4_ = fVar2 + auVar49._28_4_;
        fVar2 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 0x18))->_vptr_Allocator +
                          lVar30 + lVar34);
        auVar54._0_4_ = fVar1 * fVar5 + auVar48._0_4_;
        auVar54._4_4_ = fVar1 * fVar6 + auVar48._4_4_;
        auVar54._8_4_ = fVar1 * fVar7 + auVar48._8_4_;
        auVar54._12_4_ = fVar1 * fVar8 + auVar48._12_4_;
        auVar54._16_4_ = fVar1 * fVar9 + auVar48._16_4_;
        auVar54._20_4_ = fVar1 * fVar10 + auVar48._20_4_;
        auVar54._24_4_ = fVar1 * fVar11 + auVar48._24_4_;
        auVar54._28_4_ = fVar1 + auVar48._28_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 0x18))->_vptr_Allocator +
                          lVar30 + lVar34 + 4);
        auVar49._0_4_ = fVar2 * fVar5 + auVar43._0_4_;
        auVar49._4_4_ = fVar2 * fVar6 + auVar43._4_4_;
        auVar49._8_4_ = fVar2 * fVar7 + auVar43._8_4_;
        auVar49._12_4_ = fVar2 * fVar8 + auVar43._12_4_;
        auVar49._16_4_ = fVar2 * fVar9 + auVar43._16_4_;
        auVar49._20_4_ = fVar2 * fVar10 + auVar43._20_4_;
        auVar49._24_4_ = fVar2 * fVar11 + auVar43._24_4_;
        auVar49._28_4_ = fVar2 + auVar43._28_4_;
        auVar43._0_4_ = fVar1 * fVar5 + auVar42._0_4_;
        auVar43._4_4_ = fVar1 * fVar6 + auVar42._4_4_;
        auVar43._8_4_ = fVar1 * fVar7 + auVar42._8_4_;
        auVar43._12_4_ = fVar1 * fVar8 + auVar42._12_4_;
        auVar43._16_4_ = fVar1 * fVar9 + auVar42._16_4_;
        auVar43._20_4_ = fVar1 * fVar10 + auVar42._20_4_;
        auVar43._24_4_ = fVar1 * fVar11 + auVar42._24_4_;
        auVar43._28_4_ = fVar1 + auVar42._28_4_;
        lVar30 = lVar30 + 0x20;
        auVar42 = auVar43;
        auVar43 = auVar49;
        auVar48 = auVar54;
        auVar49 = auVar59;
        auVar54 = auVar63;
        auVar62 = auVar68;
        auVar59 = auVar70;
        auVar63 = auVar72;
      }
      auVar74._16_16_ = auVar59._0_16_;
      auVar74._0_16_ = auVar63._0_16_;
      *pauVar27 = auVar74;
      auVar75._16_16_ = auVar54._0_16_;
      auVar75._0_16_ = auVar62._0_16_;
      pauVar27[1] = auVar75;
      auVar76._16_16_ = auVar48._0_16_;
      auVar76._0_16_ = auVar49._0_16_;
      pauVar27[2] = auVar76;
      auVar77._16_16_ = auVar42._0_16_;
      auVar77._0_16_ = auVar43._0_16_;
      pauVar27[3] = auVar77;
      auVar59 = vperm2f128_avx(auVar63,auVar59,0x31);
      *pauVar29 = auVar59;
      auVar54 = vperm2f128_avx(auVar62,auVar54,0x31);
      pauVar29[1] = auVar54;
      auVar48 = vperm2f128_avx(auVar49,auVar48,0x31);
      pauVar29[2] = auVar48;
      auVar42 = vperm2f128_avx(auVar43,auVar42,0x31);
      pauVar29[3] = auVar42;
      pauVar27 = pauVar27 + 4;
      pauVar29 = pauVar29 + 4;
      lVar25 = lVar25 + 1;
    }
    uVar19 = 0;
    for (; (int)((uint)uVar20 | 3) < (int)uVar4; uVar20 = (ulong)((uint)uVar20 + 4)) {
      lVar25 = local_88 * local_c8._16_8_ *
               (ulong)((uVar19 & 1) + ((uint)(uVar20 >> 3) & 0x1fffffff));
      auVar42 = *pauVar22;
      lVar30 = 0;
      uVar33 = uVar15;
      auVar43 = auVar42;
      auVar48 = auVar42;
      auVar49 = auVar42;
      while (iVar14 = (int)uVar33, uVar33 = (ulong)(iVar14 - 1), iVar14 != 0) {
        fVar1 = *(float *)((long)(_func_int ***)local_c8._0_8_ + lVar30 + lVar25);
        auVar54 = *(undefined1 (*) [32])
                   ((long)kernel->data + lVar30 * 2 + kernel->cstep * uVar28 * kernel->elemsize);
        fVar2 = *(float *)((long)(_func_int ***)local_c8._0_8_ + lVar30 + lVar25 + 4);
        fVar5 = auVar54._0_4_;
        fVar6 = auVar54._4_4_;
        fVar7 = auVar54._8_4_;
        fVar8 = auVar54._12_4_;
        fVar9 = auVar54._16_4_;
        fVar10 = auVar54._20_4_;
        fVar11 = auVar54._24_4_;
        auVar44._0_4_ = fVar1 * fVar5 + auVar42._0_4_;
        auVar44._4_4_ = fVar1 * fVar6 + auVar42._4_4_;
        auVar44._8_4_ = fVar1 * fVar7 + auVar42._8_4_;
        auVar44._12_4_ = fVar1 * fVar8 + auVar42._12_4_;
        auVar44._16_4_ = fVar1 * fVar9 + auVar42._16_4_;
        auVar44._20_4_ = fVar1 * fVar10 + auVar42._20_4_;
        auVar44._24_4_ = fVar1 * fVar11 + auVar42._24_4_;
        auVar44._28_4_ = fVar1 + auVar42._28_4_;
        fVar3 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 8))->_vptr_Allocator +
                          lVar30 + lVar25);
        auVar55._0_4_ = fVar2 * fVar5 + auVar48._0_4_;
        auVar55._4_4_ = fVar2 * fVar6 + auVar48._4_4_;
        auVar55._8_4_ = fVar2 * fVar7 + auVar48._8_4_;
        auVar55._12_4_ = fVar2 * fVar8 + auVar48._12_4_;
        auVar55._16_4_ = fVar2 * fVar9 + auVar48._16_4_;
        auVar55._20_4_ = fVar2 * fVar10 + auVar48._20_4_;
        auVar55._24_4_ = fVar2 * fVar11 + auVar48._24_4_;
        auVar55._28_4_ = fVar1 + auVar48._28_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 8))->_vptr_Allocator +
                          lVar30 + lVar25 + 4);
        auVar50._0_4_ = fVar3 * fVar5 + auVar43._0_4_;
        auVar50._4_4_ = fVar3 * fVar6 + auVar43._4_4_;
        auVar50._8_4_ = fVar3 * fVar7 + auVar43._8_4_;
        auVar50._12_4_ = fVar3 * fVar8 + auVar43._12_4_;
        auVar50._16_4_ = fVar3 * fVar9 + auVar43._16_4_;
        auVar50._20_4_ = fVar3 * fVar10 + auVar43._20_4_;
        auVar50._24_4_ = fVar3 * fVar11 + auVar43._24_4_;
        auVar50._28_4_ = fVar3 + auVar43._28_4_;
        auVar60._0_4_ = fVar1 * fVar5 + auVar49._0_4_;
        auVar60._4_4_ = fVar1 * fVar6 + auVar49._4_4_;
        auVar60._8_4_ = fVar1 * fVar7 + auVar49._8_4_;
        auVar60._12_4_ = fVar1 * fVar8 + auVar49._12_4_;
        auVar60._16_4_ = fVar1 * fVar9 + auVar49._16_4_;
        auVar60._20_4_ = fVar1 * fVar10 + auVar49._20_4_;
        auVar60._24_4_ = fVar1 * fVar11 + auVar49._24_4_;
        auVar60._28_4_ = fVar1 + auVar49._28_4_;
        lVar30 = lVar30 + 0x10;
        auVar42 = auVar44;
        auVar43 = auVar50;
        auVar48 = auVar55;
        auVar49 = auVar60;
      }
      auVar64._16_16_ = auVar48._0_16_;
      auVar64._0_16_ = auVar42._0_16_;
      *pauVar27 = auVar64;
      auVar65._16_16_ = auVar49._0_16_;
      auVar65._0_16_ = auVar43._0_16_;
      pauVar27[1] = auVar65;
      auVar42 = vperm2f128_avx(auVar42,auVar48,0x31);
      *pauVar29 = auVar42;
      auVar42 = vperm2f128_avx(auVar43,auVar49,0x31);
      pauVar29[1] = auVar42;
      pauVar27 = pauVar27 + 2;
      pauVar29 = pauVar29 + 2;
      uVar19 = (uint)(byte)((char)uVar19 + 1);
    }
    while( true ) {
      uVar19 = (uint)uVar20;
      if ((int)uVar4 <= (int)uVar19) break;
      pfVar17 = (float *)(kernel->cstep * uVar28 * kernel->elemsize + (long)kernel->data);
      auVar42 = *pauVar22;
      for (lVar25 = 0; (int)uVar15 != (int)lVar25; lVar25 = lVar25 + 1) {
        fVar1 = *(float *)((long)(_func_int ***)local_c8._0_8_ +
                          lVar25 * 4 +
                          local_88 * local_c8._16_8_ *
                          (ulong)((uVar19 & 3) + ((uint)(uVar20 >> 3) & 0x1fffffff) +
                                 (uint)((uVar19 >> 2 & 1) != 0)));
        auVar45._0_4_ = fVar1 * *pfVar17 + auVar42._0_4_;
        auVar45._4_4_ = fVar1 * pfVar17[1] + auVar42._4_4_;
        auVar45._8_4_ = fVar1 * pfVar17[2] + auVar42._8_4_;
        auVar45._12_4_ = fVar1 * pfVar17[3] + auVar42._12_4_;
        auVar45._16_4_ = fVar1 * pfVar17[4] + auVar42._16_4_;
        auVar45._20_4_ = fVar1 * pfVar17[5] + auVar42._20_4_;
        auVar45._24_4_ = fVar1 * pfVar17[6] + auVar42._24_4_;
        auVar45._28_4_ = fVar1 + auVar42._28_4_;
        pfVar17 = pfVar17 + 8;
        auVar42 = auVar45;
      }
      *(undefined1 (*) [16])*pauVar27 = auVar42._0_16_;
      *(undefined1 (*) [16])*pauVar29 = auVar42._16_16_;
      pauVar27 = (undefined1 (*) [32])((long)*pauVar27 + 0x10);
      pauVar29 = (undefined1 (*) [32])(*pauVar29 + 0x10);
      uVar20 = (ulong)(uVar19 + 1);
    }
  }
  auVar37 = ZEXT416(0) << 0x40;
  for (uVar28 = local_78 & 0xfffffffffffffffe; (long)uVar28 < (long)local_78; uVar28 = uVar28 + 1) {
    pauVar31 = (undefined1 (*) [16])
               (local_60->cstep * uVar28 * local_60->elemsize + (long)local_60->data);
    zeros[0] = (float)auVar37._0_4_;
    zeros[1] = (float)auVar37._4_4_;
    zeros[2] = (float)auVar37._8_4_;
    zeros[3] = (float)auVar37._12_4_;
    pauVar32 = (undefined1 (*) [16])(uVar28 * 0x10 + (long)local_68);
    if (local_68 == (void *)0x0) {
      pauVar32 = (undefined1 (*) [16])zeros;
    }
    uVar20 = (ulong)(uint)((int)uVar28 >> 0x1f) << 0x20 | uVar28 & 0xffffffff;
    lVar25 = (long)((int)((long)uVar20 % 2) + (int)((long)uVar20 / 2));
    lVar30 = 0;
    for (uVar20 = 0; (long)(uVar20 | 7) < lVar35; uVar20 = uVar20 + 8) {
      auVar38 = *pauVar32;
      lVar23 = local_88 * local_c8._16_8_ * lVar30;
      lVar34 = 0;
      uVar33 = uVar15;
      auVar41 = auVar38;
      auVar51 = auVar38;
      auVar56 = auVar38;
      auVar40 = auVar38;
      auVar47 = auVar38;
      auVar53 = auVar38;
      auVar58 = auVar38;
      while (iVar14 = (int)uVar33, uVar33 = (ulong)(iVar14 - 1), iVar14 != 0) {
        pfVar17 = (float *)((long)kernel->data + lVar34 + kernel->cstep * lVar25 * kernel->elemsize)
        ;
        fVar3 = *pfVar17;
        fVar5 = pfVar17[1];
        fVar6 = pfVar17[2];
        fVar7 = pfVar17[3];
        fVar1 = *(float *)((long)(_func_int ***)local_c8._0_8_ + lVar34 * 2 + lVar23);
        fVar2 = *(float *)((long)(_func_int ***)local_c8._0_8_ + lVar34 * 2 + lVar23 + 4);
        auVar39._0_4_ = fVar1 * fVar3 + auVar38._0_4_;
        auVar39._4_4_ = fVar1 * fVar5 + auVar38._4_4_;
        auVar39._8_4_ = fVar1 * fVar6 + auVar38._8_4_;
        auVar39._12_4_ = fVar1 * fVar7 + auVar38._12_4_;
        auVar46._0_4_ = fVar2 * fVar3 + auVar41._0_4_;
        auVar46._4_4_ = fVar2 * fVar5 + auVar41._4_4_;
        auVar46._8_4_ = fVar2 * fVar6 + auVar41._8_4_;
        auVar46._12_4_ = fVar2 * fVar7 + auVar41._12_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 8))->_vptr_Allocator +
                          lVar34 * 2 + lVar23);
        fVar2 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 8))->_vptr_Allocator +
                          lVar34 * 2 + lVar23 + 4);
        auVar52._0_4_ = fVar1 * fVar3 + auVar51._0_4_;
        auVar52._4_4_ = fVar1 * fVar5 + auVar51._4_4_;
        auVar52._8_4_ = fVar1 * fVar6 + auVar51._8_4_;
        auVar52._12_4_ = fVar1 * fVar7 + auVar51._12_4_;
        auVar57._0_4_ = fVar2 * fVar3 + auVar56._0_4_;
        auVar57._4_4_ = fVar2 * fVar5 + auVar56._4_4_;
        auVar57._8_4_ = fVar2 * fVar6 + auVar56._8_4_;
        auVar57._12_4_ = fVar2 * fVar7 + auVar56._12_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 0x10))->_vptr_Allocator +
                          lVar34 * 2 + lVar23);
        fVar2 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 0x10))->_vptr_Allocator +
                          lVar34 * 2 + lVar23 + 4);
        auVar61._0_4_ = fVar1 * fVar3 + auVar40._0_4_;
        auVar61._4_4_ = fVar1 * fVar5 + auVar40._4_4_;
        auVar61._8_4_ = fVar1 * fVar6 + auVar40._8_4_;
        auVar61._12_4_ = fVar1 * fVar7 + auVar40._12_4_;
        auVar66._0_4_ = fVar2 * fVar3 + auVar47._0_4_;
        auVar66._4_4_ = fVar2 * fVar5 + auVar47._4_4_;
        auVar66._8_4_ = fVar2 * fVar6 + auVar47._8_4_;
        auVar66._12_4_ = fVar2 * fVar7 + auVar47._12_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 0x18))->_vptr_Allocator +
                          lVar34 * 2 + lVar23);
        fVar2 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 0x18))->_vptr_Allocator +
                          lVar34 * 2 + lVar23 + 4);
        auVar69._0_4_ = fVar1 * fVar3 + auVar53._0_4_;
        auVar69._4_4_ = fVar1 * fVar5 + auVar53._4_4_;
        auVar69._8_4_ = fVar1 * fVar6 + auVar53._8_4_;
        auVar69._12_4_ = fVar1 * fVar7 + auVar53._12_4_;
        auVar71._0_4_ = fVar2 * fVar3 + auVar58._0_4_;
        auVar71._4_4_ = fVar2 * fVar5 + auVar58._4_4_;
        auVar71._8_4_ = fVar2 * fVar6 + auVar58._8_4_;
        auVar71._12_4_ = fVar2 * fVar7 + auVar58._12_4_;
        lVar34 = lVar34 + 0x10;
        auVar38 = auVar39;
        auVar41 = auVar46;
        auVar51 = auVar52;
        auVar56 = auVar57;
        auVar40 = auVar61;
        auVar47 = auVar66;
        auVar53 = auVar69;
        auVar58 = auVar71;
      }
      *pauVar31 = auVar38;
      pauVar31[1] = auVar41;
      pauVar31[2] = auVar51;
      pauVar31[3] = auVar56;
      pauVar31[4] = auVar40;
      pauVar31[5] = auVar47;
      pauVar31[6] = auVar53;
      pauVar31[7] = auVar58;
      pauVar31 = pauVar31 + 8;
      lVar30 = lVar30 + 1;
    }
    uVar19 = 0;
    for (; (int)((uint)uVar20 | 3) < (int)uVar4; uVar20 = (ulong)((uint)uVar20 + 4)) {
      auVar38 = *pauVar32;
      lVar30 = local_88 * local_c8._16_8_ *
               (ulong)((uVar19 & 1) + ((uint)(uVar20 >> 3) & 0x1fffffff));
      lVar34 = 0;
      uVar33 = uVar15;
      auVar41 = auVar38;
      auVar51 = auVar38;
      auVar56 = auVar38;
      while (iVar14 = (int)uVar33, uVar33 = (ulong)(iVar14 - 1), iVar14 != 0) {
        pfVar17 = (float *)((long)kernel->data + lVar34 + kernel->cstep * lVar25 * kernel->elemsize)
        ;
        fVar3 = *pfVar17;
        fVar5 = pfVar17[1];
        fVar6 = pfVar17[2];
        fVar7 = pfVar17[3];
        fVar1 = *(float *)((long)(_func_int ***)local_c8._0_8_ + lVar34 + lVar30);
        fVar2 = *(float *)((long)(_func_int ***)local_c8._0_8_ + lVar34 + lVar30 + 4);
        auVar40._0_4_ = fVar1 * fVar3 + auVar38._0_4_;
        auVar40._4_4_ = fVar1 * fVar5 + auVar38._4_4_;
        auVar40._8_4_ = fVar1 * fVar6 + auVar38._8_4_;
        auVar40._12_4_ = fVar1 * fVar7 + auVar38._12_4_;
        auVar47._0_4_ = fVar2 * fVar3 + auVar41._0_4_;
        auVar47._4_4_ = fVar2 * fVar5 + auVar41._4_4_;
        auVar47._8_4_ = fVar2 * fVar6 + auVar41._8_4_;
        auVar47._12_4_ = fVar2 * fVar7 + auVar41._12_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 8))->_vptr_Allocator +
                          lVar34 + lVar30);
        fVar2 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 8))->_vptr_Allocator +
                          lVar34 + lVar30 + 4);
        auVar53._0_4_ = fVar1 * fVar3 + auVar51._0_4_;
        auVar53._4_4_ = fVar1 * fVar5 + auVar51._4_4_;
        auVar53._8_4_ = fVar1 * fVar6 + auVar51._8_4_;
        auVar53._12_4_ = fVar1 * fVar7 + auVar51._12_4_;
        auVar58._0_4_ = fVar2 * fVar3 + auVar56._0_4_;
        auVar58._4_4_ = fVar2 * fVar5 + auVar56._4_4_;
        auVar58._8_4_ = fVar2 * fVar6 + auVar56._8_4_;
        auVar58._12_4_ = fVar2 * fVar7 + auVar56._12_4_;
        lVar34 = lVar34 + 0x10;
        auVar38 = auVar40;
        auVar41 = auVar47;
        auVar51 = auVar53;
        auVar56 = auVar58;
      }
      *pauVar31 = auVar38;
      pauVar31[1] = auVar41;
      pauVar31[2] = auVar51;
      pauVar31[3] = auVar56;
      pauVar31 = pauVar31 + 4;
      uVar19 = (uint)(byte)((char)uVar19 + 1);
    }
    while( true ) {
      uVar19 = (uint)uVar20;
      if ((int)uVar4 <= (int)uVar19) break;
      pfVar17 = (float *)(kernel->cstep * lVar25 * kernel->elemsize + (long)kernel->data);
      auVar38 = *pauVar32;
      for (lVar30 = 0; (int)uVar15 != (int)lVar30; lVar30 = lVar30 + 1) {
        fVar1 = *(float *)((long)(_func_int ***)local_c8._0_8_ +
                          lVar30 * 4 +
                          local_88 * local_c8._16_8_ *
                          (ulong)((uVar19 & 3) + ((uint)(uVar20 >> 3) & 0x1fffffff) +
                                 (uint)((uVar19 >> 2 & 1) != 0)));
        auVar41._0_4_ = fVar1 * *pfVar17 + auVar38._0_4_;
        auVar41._4_4_ = fVar1 * pfVar17[1] + auVar38._4_4_;
        auVar41._8_4_ = fVar1 * pfVar17[2] + auVar38._8_4_;
        auVar41._12_4_ = fVar1 * pfVar17[3] + auVar38._12_4_;
        pfVar17 = pfVar17 + 4;
        auVar38 = auVar41;
      }
      *pauVar31 = auVar38;
      pauVar31 = pauVar31 + 1;
      uVar20 = (ulong)(uVar19 + 1);
    }
  }
  piVar12 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
  if (piVar12 != (int *)0x0) {
    LOCK();
    *piVar12 = *piVar12 + -1;
    UNLOCK();
    if (*piVar12 == 0) {
      if ((Allocator *)local_c8._32_8_ == (Allocator *)0x0) {
        free((void *)local_c8._0_8_);
      }
      else {
        (*(*(_func_int ***)local_c8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack8to4_avx(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 32u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + (size % 8) / 4 + size % 4, 32u, 8, opt.workspace_allocator);
    else if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + size % 4, 32u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 32u, 8, opt.workspace_allocator);
    {
        int nn_size = size / 8;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 8;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 8x8
                    __m256 _r0 = _mm256_load_ps(img0);
                    __m256 _r1 = _mm256_load_ps(img0 + 8);
                    __m256 _r2 = _mm256_load_ps(img0 + 8 * 2);
                    __m256 _r3 = _mm256_load_ps(img0 + 8 * 3);
                    __m256 _r4 = _mm256_load_ps(img0 + 8 * 4);
                    __m256 _r5 = _mm256_load_ps(img0 + 8 * 5);
                    __m256 _r6 = _mm256_load_ps(img0 + 8 * 6);
                    __m256 _r7 = _mm256_load_ps(img0 + 8 * 7);

                    __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                    __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                    __m256 _tmp2 = _mm256_unpacklo_ps(_r2, _r3);
                    __m256 _tmp3 = _mm256_unpackhi_ps(_r2, _r3);
                    __m256 _tmp4 = _mm256_unpacklo_ps(_r4, _r5);
                    __m256 _tmp5 = _mm256_unpackhi_ps(_r4, _r5);
                    __m256 _tmp6 = _mm256_unpacklo_ps(_r6, _r7);
                    __m256 _tmp7 = _mm256_unpackhi_ps(_r6, _r7);
                    __m256 _tmp8 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmp9 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmpa = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmpb = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmpc = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmpd = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmpe = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmpf = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(3, 2, 3, 2));
                    _r0 = _mm256_permute2f128_ps(_tmp8, _tmpc, _MM_SHUFFLE(0, 2, 0, 0));
                    _r1 = _mm256_permute2f128_ps(_tmp9, _tmpd, _MM_SHUFFLE(0, 2, 0, 0));
                    _r2 = _mm256_permute2f128_ps(_tmpa, _tmpe, _MM_SHUFFLE(0, 2, 0, 0));
                    _r3 = _mm256_permute2f128_ps(_tmpb, _tmpf, _MM_SHUFFLE(0, 2, 0, 0));
                    _r4 = _mm256_permute2f128_ps(_tmp8, _tmpc, _MM_SHUFFLE(0, 3, 0, 1));
                    _r5 = _mm256_permute2f128_ps(_tmp9, _tmpd, _MM_SHUFFLE(0, 3, 0, 1));
                    _r6 = _mm256_permute2f128_ps(_tmpa, _tmpe, _MM_SHUFFLE(0, 3, 0, 1));
                    _r7 = _mm256_permute2f128_ps(_tmpb, _tmpf, _MM_SHUFFLE(0, 3, 0, 1));

                    _mm256_store_ps(tmpptr, _r0);
                    _mm256_store_ps(tmpptr + 8, _r1);
                    _mm256_store_ps(tmpptr + 8 * 2, _r2);
                    _mm256_store_ps(tmpptr + 8 * 3, _r3);
                    _mm256_store_ps(tmpptr + 8 * 4, _r4);
                    _mm256_store_ps(tmpptr + 8 * 5, _r5);
                    _mm256_store_ps(tmpptr + 8 * 6, _r6);
                    _mm256_store_ps(tmpptr + 8 * 7, _r7);

                    img0 += size * 8;
                    tmpptr += 64;
                }
            }
        }

        remain_size_start += nn_size << 3;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 8;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 8x4
                    __m256 _r0 = _mm256_load_ps(img0);
                    __m256 _r1 = _mm256_load_ps(img0 + 8);
                    __m256 _r2 = _mm256_load_ps(img0 + 8 * 2);
                    __m256 _r3 = _mm256_load_ps(img0 + 8 * 3);

                    __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                    __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                    __m256 _tmp2 = _mm256_unpacklo_ps(_r2, _r3);
                    __m256 _tmp3 = _mm256_unpackhi_ps(_r2, _r3);
                    __m256 _tmp4 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmp5 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmp6 = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmp7 = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                    _r0 = _mm256_permute2f128_ps(_tmp4, _tmp5, _MM_SHUFFLE(0, 2, 0, 0));
                    _r1 = _mm256_permute2f128_ps(_tmp6, _tmp7, _MM_SHUFFLE(0, 2, 0, 0));
                    _r2 = _mm256_permute2f128_ps(_tmp4, _tmp5, _MM_SHUFFLE(0, 3, 0, 1));
                    _r3 = _mm256_permute2f128_ps(_tmp6, _tmp7, _MM_SHUFFLE(0, 3, 0, 1));

                    _mm256_store_ps(tmpptr, _r0);
                    _mm256_store_ps(tmpptr + 8, _r1);
                    _mm256_store_ps(tmpptr + 8 * 2, _r2);
                    _mm256_store_ps(tmpptr + 8 * 3, _r3);

                    img0 += size * 8;
                    tmpptr += 32;
                }
            }
        }

        remain_size_start += nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 8;

                for (int k = 0; k < maxk; k++)
                {
                    __m256 _val = _mm256_load_ps(img0);
                    _mm256_store_ps(tmpptr, _val);

                    img0 += size * 8;
                    tmpptr += 8;
                }
            }
        }
    }

    int nn_outch = 0;
    int remain_outch_start = 0;

    nn_outch = outch >> 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 2;

        float* outptr0 = top_blob.channel(p);
        float* outptr1 = top_blob.channel(p + 1);

        const float zeros[8] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 4 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            float* tmpptr = tmp.channel(i / 8);
            const float* kptr = kernel.channel(p / 2);

            int nn = inch * maxk * 8; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);
            __m256 _sum1 = _sum0;
            __m256 _sum2 = _sum0;
            __m256 _sum3 = _sum0;
            __m256 _sum4 = _sum0;
            __m256 _sum5 = _sum0;
            __m256 _sum6 = _sum0;
            __m256 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);

                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _val1 = _mm256_broadcast_ss(tmpptr + 1);
                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                __m256 _val2 = _mm256_broadcast_ss(tmpptr + 2);
                __m256 _val3 = _mm256_broadcast_ss(tmpptr + 3);
                _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);
                __m256 _val4 = _mm256_broadcast_ss(tmpptr + 4);
                __m256 _val5 = _mm256_broadcast_ss(tmpptr + 5);
                _sum4 = _mm256_comp_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm256_comp_fmadd_ps(_val5, _w0, _sum5);
                __m256 _val6 = _mm256_broadcast_ss(tmpptr + 6);
                __m256 _val7 = _mm256_broadcast_ss(tmpptr + 7);
                _sum6 = _mm256_comp_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm256_comp_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr += 8;
            }

            _mm_store_ps(outptr0, _mm256_extractf128_ps(_sum0, 0));
            _mm_store_ps(outptr0 + 4, _mm256_extractf128_ps(_sum1, 0));
            _mm_store_ps(outptr0 + 8, _mm256_extractf128_ps(_sum2, 0));
            _mm_store_ps(outptr0 + 12, _mm256_extractf128_ps(_sum3, 0));
            _mm_store_ps(outptr0 + 16, _mm256_extractf128_ps(_sum4, 0));
            _mm_store_ps(outptr0 + 20, _mm256_extractf128_ps(_sum5, 0));
            _mm_store_ps(outptr0 + 24, _mm256_extractf128_ps(_sum6, 0));
            _mm_store_ps(outptr0 + 28, _mm256_extractf128_ps(_sum7, 0));
            _mm_store_ps(outptr1, _mm256_extractf128_ps(_sum0, 1));
            _mm_store_ps(outptr1 + 4, _mm256_extractf128_ps(_sum1, 1));
            _mm_store_ps(outptr1 + 8, _mm256_extractf128_ps(_sum2, 1));
            _mm_store_ps(outptr1 + 12, _mm256_extractf128_ps(_sum3, 1));
            _mm_store_ps(outptr1 + 16, _mm256_extractf128_ps(_sum4, 1));
            _mm_store_ps(outptr1 + 20, _mm256_extractf128_ps(_sum5, 1));
            _mm_store_ps(outptr1 + 24, _mm256_extractf128_ps(_sum6, 1));
            _mm_store_ps(outptr1 + 28, _mm256_extractf128_ps(_sum7, 1));

            outptr0 += 32;
            outptr1 += 32;
        }
        for (; i + 3 < size; i += 4)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);
            const float* kptr = kernel.channel(p / 2);

            int nn = inch * maxk * 8; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);
            __m256 _sum1 = _sum0;
            __m256 _sum2 = _sum0;
            __m256 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);

                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _val1 = _mm256_broadcast_ss(tmpptr + 1);
                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                __m256 _val2 = _mm256_broadcast_ss(tmpptr + 2);
                __m256 _val3 = _mm256_broadcast_ss(tmpptr + 3);
                _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr += 8;
            }

            _mm_store_ps(outptr0, _mm256_extractf128_ps(_sum0, 0));
            _mm_store_ps(outptr0 + 4, _mm256_extractf128_ps(_sum1, 0));
            _mm_store_ps(outptr0 + 8, _mm256_extractf128_ps(_sum2, 0));
            _mm_store_ps(outptr0 + 12, _mm256_extractf128_ps(_sum3, 0));
            _mm_store_ps(outptr1, _mm256_extractf128_ps(_sum0, 1));
            _mm_store_ps(outptr1 + 4, _mm256_extractf128_ps(_sum1, 1));
            _mm_store_ps(outptr1 + 8, _mm256_extractf128_ps(_sum2, 1));
            _mm_store_ps(outptr1 + 12, _mm256_extractf128_ps(_sum3, 1));

            outptr0 += 16;
            outptr1 += 16;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);
            const float* kptr = kernel.channel(p / 2);

            int nn = inch * maxk * 8; // inch always > 0

            __m256 _sum = _mm256_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);
                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);

                tmpptr += 1;
                kptr += 8;
            }

            _mm_store_ps(outptr0, _mm256_extractf128_ps(_sum, 0));
            _mm_store_ps(outptr1, _mm256_extractf128_ps(_sum, 1));

            outptr0 += 4;
            outptr1 += 4;
        }
    }

    remain_outch_start += nn_outch << 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[4] = {0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 4 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            float* tmpptr = tmp.channel(i / 8);
            const float* kptr = kernel.channel(p / 2 + p % 2);

            int nn = inch * maxk * 8; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;
            __m128 _sum2 = _sum0;
            __m128 _sum3 = _sum0;
            __m128 _sum4 = _sum0;
            __m128 _sum5 = _sum0;
            __m128 _sum6 = _sum0;
            __m128 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);
                __m128 _val4 = _mm_load1_ps(tmpptr + 4);
                __m128 _val5 = _mm_load1_ps(tmpptr + 5);
                _sum4 = _mm_comp_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm_comp_fmadd_ps(_val5, _w0, _sum5);
                __m128 _val6 = _mm_load1_ps(tmpptr + 6);
                __m128 _val7 = _mm_load1_ps(tmpptr + 7);
                _sum6 = _mm_comp_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm_comp_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 8, _sum2);
            _mm_store_ps(outptr0 + 12, _sum3);
            _mm_store_ps(outptr0 + 16, _sum4);
            _mm_store_ps(outptr0 + 20, _sum5);
            _mm_store_ps(outptr0 + 24, _sum6);
            _mm_store_ps(outptr0 + 28, _sum7);

            outptr0 += 32;
        }
        for (; i + 3 < size; i += 4)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);
            const float* kptr = kernel.channel(p / 2 + p % 2);

            int nn = inch * maxk * 8; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;
            __m128 _sum2 = _sum0;
            __m128 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 8, _sum2);
            _mm_store_ps(outptr0 + 12, _sum3);

            outptr0 += 16;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);
            const float* kptr = kernel.channel(p / 2 + p % 2);

            int nn = inch * maxk * 8; // inch always > 0

            __m128 _sum = _mm_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr);
                __m128 _val0 = _mm_load1_ps(tmpptr);
                _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);

                tmpptr += 1;
                kptr += 4;
            }

            _mm_store_ps(outptr0, _sum);

            outptr0 += 4;
        }
    }
}